

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t b_find_first_key(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_node_t *piVar1;
  ion_bpp_buffer_t *piVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_buffer_t *buf;
  ion_bpp_buffer_t *local_30;
  
  local_30 = (ion_bpp_buffer_t *)((long)handle + 0x20);
  do {
    piVar2 = local_30;
    piVar1 = local_30->p;
    if ((*(ushort *)piVar1 & 1) != 0) {
      if (*(ushort *)piVar1 < 2) {
        return bErrKeyNotFound;
      }
      memcpy(key,&piVar1->fkey,(long)*(int *)((long)handle + 8));
      piVar1 = piVar2->p;
      *rec = *(ion_bpp_external_address_t *)(&piVar1->fkey + *(int *)((long)handle + 8));
      *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar2;
      *(ion_bpp_key_t **)((long)handle + 0xb0) = &piVar1->fkey;
      return bErrOk;
    }
    iVar3 = readDisk(handle,piVar1->childLT,&local_30);
  } while (iVar3 == bErrOk);
  return iVar3;
}

Assistant:

ion_bpp_err_t
b_find_first_key(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*buf;				/* buffer */

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	while (!leaf(buf)) {
		if ((rc = readDisk(handle, childLT(fkey(buf)), &buf)) != 0) {
			return rc;
		}
	}

	if (ct(buf) == 0) {
		return bErrKeyNotFound;
	}

	memcpy(key, key(fkey(buf)), h->keySize);
	*rec		= rec(fkey(buf));
	h->curBuf	= buf;
	h->curKey	= fkey(buf);
	return bErrOk;
}